

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

fdb_status fdb_iterator_seek_to_max(fdb_iterator *iterator)

{
  fdb_iterator *in_RDI;
  fdb_status ret;
  fdb_iterator *in_stack_000000f8;
  fdb_status local_14;
  fdb_status local_4;
  
  if ((in_RDI == (fdb_iterator *)0x0) || (in_RDI->handle == (fdb_kvs_handle *)0x0)) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    if (in_RDI->hbtrie_iterator == (hbtrie_iterator *)0x0) {
      local_14 = _fdb_iterator_seek_to_max_seq(in_RDI);
    }
    else {
      local_14 = _fdb_iterator_seek_to_max_key(in_stack_000000f8);
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_seek_to_max(fdb_iterator *iterator)
{
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_status ret;
    LATENCY_STAT_START();

    if (!iterator->hbtrie_iterator) {
        ret = _fdb_iterator_seek_to_max_seq(iterator);
    } else {
        ret = _fdb_iterator_seek_to_max_key(iterator);
    }
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_SEEK_MAX);
    return ret;
}